

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::GetGeneratorDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  bool bVar1;
  reference ppcVar2;
  pointer ppVar3;
  cmExternalMakefileProjectGenerator *pcVar4;
  cmExternalMakefileProjectGenerator *generator;
  cmDocumentationEntry e_1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_98;
  iterator local_90;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_88;
  const_iterator i_1;
  undefined1 local_70 [8];
  cmDocumentationEntry e;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_28;
  __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_20;
  const_iterator i;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v_local;
  cmake *this_local;
  
  i._M_current = (cmGlobalGeneratorFactory **)v;
  local_28._M_current =
       (cmGlobalGeneratorFactory **)
       std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::begin
                 (&this->Generators);
  __gnu_cxx::
  __normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
  ::__normal_iterator<cmGlobalGeneratorFactory**>
            ((__normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
              *)&local_20,&local_28);
  while( true ) {
    e.Brief.field_2._8_8_ =
         std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::end
                   (&this->Generators);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                        *)((long)&e.Brief.field_2 + 8));
    if (!bVar1) break;
    cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)local_70);
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&local_20);
    (*(*ppcVar2)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar2,(cmDocumentationEntry *)local_70);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)i._M_current,
               (value_type *)local_70);
    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_70);
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&local_20);
  }
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
       ::begin(&this->ExtraGenerators);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  ::_Rb_tree_const_iterator(&local_88,&local_90);
  while( true ) {
    e_1.Brief.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
         ::end(&this->ExtraGenerators);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
    ::_Rb_tree_const_iterator(&local_98,(iterator *)((long)&e_1.Brief.field_2 + 8));
    bVar1 = std::operator!=(&local_88,&local_98);
    if (!bVar1) break;
    cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)&generator);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
             ::operator->(&local_88);
    pcVar4 = (*ppVar3->second)();
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
             ::operator->(&local_88);
    (*pcVar4->_vptr_cmExternalMakefileProjectGenerator[3])(pcVar4,&generator,ppVar3);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
             ::operator->(&local_88);
    std::__cxx11::string::operator=((string *)&generator,(string *)ppVar3);
    if (pcVar4 != (cmExternalMakefileProjectGenerator *)0x0) {
      (*pcVar4->_vptr_cmExternalMakefileProjectGenerator[1])();
    }
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)i._M_current,
               (value_type *)&generator);
    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)&generator);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
    ::operator++(&local_88);
  }
  return;
}

Assistant:

void cmake::GetGeneratorDocumentation(std::vector<cmDocumentationEntry>& v)
{
  for(RegisteredGeneratorsVector::const_iterator i =
      this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    cmDocumentationEntry e;
    (*i)->GetDocumentation(e);
    v.push_back(e);
    }
  for(RegisteredExtraGeneratorsMap::const_iterator i =
      this->ExtraGenerators.begin(); i != this->ExtraGenerators.end(); ++i)
    {
    cmDocumentationEntry e;
    cmExternalMakefileProjectGenerator* generator = (i->second)();
    generator->GetDocumentation(e, i->first);
    e.Name = i->first;
    delete generator;
    v.push_back(e);
    }
}